

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_filter_intra_edge_c(uint8_t *p,int sz,int strength)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int j;
  long lVar4;
  int iVar5;
  uint8_t edge [129];
  
  if (strength != 0) {
    memcpy(edge,p,(long)sz);
    iVar2 = -1;
    for (lVar1 = 1; lVar1 < sz; lVar1 = lVar1 + 1) {
      iVar3 = 0;
      for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
        iVar5 = iVar2 + (int)lVar4;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        if (sz + -1 <= iVar5) {
          iVar5 = sz + -1;
        }
        iVar3 = iVar3 + (uint)edge[iVar5] *
                        *(int *)(&DAT_004aa830 + (long)(strength + -1) * 0x14 + lVar4 * 4);
      }
      p[lVar1] = (uint8_t)(iVar3 + 8U >> 4);
      iVar2 = iVar2 + 1;
    }
  }
  return;
}

Assistant:

void av1_filter_intra_edge_c(uint8_t *p, int sz, int strength) {
  if (!strength) return;

  const int kernel[INTRA_EDGE_FILT][INTRA_EDGE_TAPS] = { { 0, 4, 8, 4, 0 },
                                                         { 0, 5, 6, 5, 0 },
                                                         { 2, 4, 4, 4, 2 } };
  const int filt = strength - 1;
  uint8_t edge[129];

  memcpy(edge, p, sz * sizeof(*p));
  for (int i = 1; i < sz; i++) {
    int s = 0;
    for (int j = 0; j < INTRA_EDGE_TAPS; j++) {
      int k = i - 2 + j;
      k = (k < 0) ? 0 : k;
      k = (k > sz - 1) ? sz - 1 : k;
      s += edge[k] * kernel[filt][j];
    }
    s = (s + 8) >> 4;
    p[i] = s;
  }
}